

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flFTP.cpp
# Opt level: O0

int __thiscall Rainbow::CommPort::Cd(CommPort *this,string *path)

{
  int iVar1;
  undefined8 uVar2;
  char message [512];
  char command [512];
  int in_stack_fffffffffffffb7c;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  void *in_stack_fffffffffffffb88;
  CommPort *in_stack_fffffffffffffb90;
  allocator<char> *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  string local_438 [24];
  string *in_stack_fffffffffffffbe0;
  string *in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbf4;
  size_t in_stack_fffffffffffffbf8;
  void *in_stack_fffffffffffffc00;
  CommPort *in_stack_fffffffffffffc08;
  char local_218 [532];
  int local_4;
  
  memset(local_218,0,0x200);
  uVar2 = std::__cxx11::string::c_str();
  snprintf(local_218,0x200,"CWD %s\r\n",uVar2);
  strlen(local_218);
  iVar1 = Send(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               in_stack_fffffffffffffb7c);
  if (iVar1 < 0) {
    local_4 = -1;
  }
  else {
    memset(&stack0xfffffffffffffbe8,0,0x200);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    iVar1 = Recv(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                 in_stack_fffffffffffffbf4,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    std::__cxx11::string::~string(local_438);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbc7);
    if (iVar1 < 0) {
      local_4 = -1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int CommPort::Cd(const std::string &path)
	{
		char command[BUFFER] = {0};
		snprintf(command, BUFFER, "CWD %s\r\n", path.c_str());

		if(Send(command, strlen(command), 0) < 0)
			return -1;
		
		char message[BUFFER] = {0};
		if(Recv(message, BUFFER - 1, 0, FTP_DIR_CHANGE, _errorMessage) < 0)
			return -1;

		return 0;
	}